

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

char * sx_os_path_exepath(char *dst,int size)

{
  uint uVar1;
  ssize_t sVar2;
  char proc_path [32];
  char acStack_38 [32];
  
  uVar1 = getpid();
  sx_snprintf(acStack_38,0x20,"/proc/%d/exe",(ulong)uVar1);
  sVar2 = readlink(acStack_38,dst,(long)size);
  dst[sVar2] = '\0';
  return dst;
}

Assistant:

char* sx_os_path_exepath(char* dst, int size)
{
#if SX_PLATFORM_WINDOWS
    GetModuleFileName(NULL, dst, size);
    return dst;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_RPI
    char proc_path[32];
    sx_snprintf(proc_path, sizeof(proc_path), "/proc/%d/exe", getpid());
    size_t bytes = readlink(proc_path, dst, size);
    dst[bytes] = 0;
    return dst;
#elif SX_PLATFORM_OSX
    _NSGetExecutablePath(dst, (uint32_t*)&size);
    return dst;
#else
    sx_unused(dst);
    sx_unused(size);
    sx_assertf(0, "not implemented");
    return NULL;
#endif
}